

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O1

void __thiscall duckdb::StarExpression::StarExpression(StarExpression *this,string *relation_name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_ParsedExpression).super_BaseExpression.type = STAR;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = STAR;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__StarExpression_019b0490;
  paVar1 = &(this->relation_name).field_2;
  (this->relation_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (relation_name_p->_M_dataplus)._M_p;
  paVar2 = &relation_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&relation_name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->relation_name).field_2 + 8) = uVar4;
  }
  else {
    (this->relation_name)._M_dataplus._M_p = pcVar3;
    (this->relation_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->relation_name)._M_string_length = relation_name_p->_M_string_length;
  (relation_name_p->_M_dataplus)._M_p = (pointer)paVar2;
  relation_name_p->_M_string_length = 0;
  (relation_name_p->field_2)._M_local_buf[0] = '\0';
  (this->exclude_list)._M_h._M_buckets = &(this->exclude_list)._M_h._M_single_bucket;
  (this->exclude_list)._M_h._M_bucket_count = 1;
  (this->exclude_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exclude_list)._M_h._M_element_count = 0;
  (this->exclude_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exclude_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exclude_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->replace_list)._M_h._M_buckets = &(this->replace_list)._M_h._M_single_bucket;
  (this->replace_list)._M_h._M_bucket_count = 1;
  (this->replace_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->replace_list)._M_h._M_element_count = 0;
  (this->replace_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->replace_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->replace_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rename_list)._M_h._M_buckets = &(this->rename_list)._M_h._M_single_bucket;
  (this->rename_list)._M_h._M_bucket_count = 1;
  (this->rename_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rename_list)._M_h._M_element_count = 0;
  (this->rename_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rename_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rename_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->rename_list)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)
   ((long)&(this->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 1) = 0;
  return;
}

Assistant:

BaseExpression(ExpressionType type, ExpressionClass expression_class)
	    : type(type), expression_class(expression_class) {
	}